

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_create_table.cpp
# Opt level: O2

unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> __thiscall
duckdb::Transformer::TransformCollateExpr(Transformer *this,PGCollateClause *collate)

{
  optional_ptr<duckdb_libpgquery::PGCollateClause,_true> in_RDX;
  string collation;
  undefined1 local_40 [8];
  Transformer *local_38;
  string local_30;
  
  TransformExpression((Transformer *)local_40,(optional_ptr<duckdb_libpgquery::PGNode,_true>)collate
                     );
  TransformCollation_abi_cxx11_(&local_30,(Transformer *)collate,in_RDX);
  make_uniq<duckdb::CollateExpression,std::__cxx11::string&,duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
            ((duckdb *)&local_38,&local_30,
             (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              *)local_40);
  (this->parent).ptr = local_38;
  ::std::__cxx11::string::~string((string *)&local_30);
  if (local_40 != (undefined1  [8])0x0) {
    (*(code *)((optional_ptr<duckdb::Transformer,_true> *)local_40)->ptr->options)();
  }
  return (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
         (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)this;
}

Assistant:

unique_ptr<ParsedExpression> Transformer::TransformCollateExpr(duckdb_libpgquery::PGCollateClause &collate) {
	auto child = TransformExpression(collate.arg);
	auto collation = TransformCollation(&collate);
	return make_uniq<CollateExpression>(collation, std::move(child));
}